

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmStringCommand.cxx
# Opt level: O0

bool __thiscall
cmStringCommand::RegexMatch
          (cmStringCommand *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *args)

{
  cmMakefile *this_00;
  bool bVar1;
  const_reference __rhs;
  char *pcVar2;
  cmRange<__gnu_cxx::__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  *r_00;
  size_type sVar3;
  char *value;
  string local_238 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_218;
  undefined1 local_1f8 [8];
  string e_1;
  size_type r;
  size_type l;
  string output;
  cmRange<__gnu_cxx::__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  local_188;
  undefined1 local_178 [8];
  string input;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_150;
  undefined1 local_130 [8];
  string e;
  undefined1 local_100 [8];
  RegularExpression re;
  string *outvar;
  string *regex;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *args_local;
  cmStringCommand *this_local;
  
  __rhs = std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::operator[](args,2);
  re.searchstring =
       (char *)std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::operator[](args,3);
  cmMakefile::ClearMatches((this->super_cmCommand).Makefile);
  cmsys::RegularExpression::RegularExpression((RegularExpression *)local_100);
  pcVar2 = (char *)std::__cxx11::string::c_str();
  bVar1 = cmsys::RegularExpression::compile((RegularExpression *)local_100,pcVar2);
  if (!bVar1) {
    std::operator+(&local_150,"sub-command REGEX, mode MATCH failed to compile regex \"",__rhs);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_130,
                   &local_150,"\".");
    std::__cxx11::string::~string((string *)&local_150);
    cmCommand::SetError(&this->super_cmCommand,(string *)local_130);
    this_local._7_1_ = false;
    input.field_2._12_4_ = 1;
    std::__cxx11::string::~string((string *)local_130);
    goto LAB_005c8a06;
  }
  local_188 = cmMakeRange<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
                        (args);
  r_00 = cmRange<__gnu_cxx::__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
         ::advance(&local_188,4);
  std::__cxx11::string::string((string *)(output.field_2._M_local_buf + 8));
  cmJoin<cmRange<__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>>
            ((string *)local_178,r_00,(string *)(output.field_2._M_local_buf + 8));
  std::__cxx11::string::~string((string *)(output.field_2._M_local_buf + 8));
  std::__cxx11::string::string((string *)&l);
  pcVar2 = (char *)std::__cxx11::string::c_str();
  bVar1 = cmsys::RegularExpression::find((RegularExpression *)local_100,pcVar2);
  if (bVar1) {
    cmMakefile::StoreMatches((this->super_cmCommand).Makefile,(RegularExpression *)local_100);
    sVar3 = cmsys::RegularExpression::start((RegularExpression *)local_100);
    e_1.field_2._8_8_ = cmsys::RegularExpression::end((RegularExpression *)local_100);
    if (e_1.field_2._8_8_ != sVar3) {
      std::__cxx11::string::substr((ulong)local_238,(ulong)local_178);
      std::__cxx11::string::operator=((string *)&l,local_238);
      std::__cxx11::string::~string(local_238);
      goto LAB_005c8983;
    }
    std::operator+(&local_218,"sub-command REGEX, mode MATCH regex \"",__rhs);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1f8,
                   &local_218,"\" matched an empty string.");
    std::__cxx11::string::~string((string *)&local_218);
    cmCommand::SetError(&this->super_cmCommand,(string *)local_1f8);
    this_local._7_1_ = false;
    input.field_2._12_4_ = 1;
    std::__cxx11::string::~string((string *)local_1f8);
  }
  else {
LAB_005c8983:
    pcVar2 = re.searchstring;
    this_00 = (this->super_cmCommand).Makefile;
    value = (char *)std::__cxx11::string::c_str();
    cmMakefile::AddDefinition(this_00,(string *)pcVar2,value);
    this_local._7_1_ = true;
    input.field_2._12_4_ = 1;
  }
  std::__cxx11::string::~string((string *)&l);
  std::__cxx11::string::~string((string *)local_178);
LAB_005c8a06:
  cmsys::RegularExpression::~RegularExpression((RegularExpression *)local_100);
  return this_local._7_1_;
}

Assistant:

bool cmStringCommand::RegexMatch(std::vector<std::string> const& args)
{
  //"STRING(REGEX MATCH <regular_expression> <output variable>
  // <input> [<input>...])\n";
  std::string const& regex = args[2];
  std::string const& outvar = args[3];

  this->Makefile->ClearMatches();
  // Compile the regular expression.
  cmsys::RegularExpression re;
  if (!re.compile(regex.c_str())) {
    std::string e =
      "sub-command REGEX, mode MATCH failed to compile regex \"" + regex +
      "\".";
    this->SetError(e);
    return false;
  }

  // Concatenate all the last arguments together.
  std::string input = cmJoin(cmMakeRange(args).advance(4), std::string());

  // Scan through the input for all matches.
  std::string output;
  if (re.find(input.c_str())) {
    this->Makefile->StoreMatches(re);
    std::string::size_type l = re.start();
    std::string::size_type r = re.end();
    if (r - l == 0) {
      std::string e = "sub-command REGEX, mode MATCH regex \"" + regex +
        "\" matched an empty string.";
      this->SetError(e);
      return false;
    }
    output = input.substr(l, r - l);
  }

  // Store the output in the provided variable.
  this->Makefile->AddDefinition(outvar, output.c_str());
  return true;
}